

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_rangeproof_rewind
              (secp256k1_context *ctx,uchar *blind_out,uint64_t *value_out,uchar *message_out,
              size_t *outlen,uchar *nonce,uint64_t *min_value,uint64_t *max_value,
              secp256k1_pedersen_commitment *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  int iVar1;
  undefined1 local_118 [8];
  secp256k1_ge genp;
  secp256k1_ge commitp;
  uchar *nonce_local;
  size_t *outlen_local;
  uchar *message_out_local;
  uint64_t *value_out_local;
  uchar *blind_out_local;
  secp256k1_context *ctx_local;
  
  if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"commit != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (proof == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (min_value == (uint64_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"min_value != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (max_value == (uint64_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"max_value != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (message_out == (uchar *)0x0 && outlen != (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"message_out != NULL || outlen == NULL");
    ctx_local._4_4_ = 0;
  }
  else if (nonce == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"nonce != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (extra_commit == (uchar *)0x0 && extra_commit_len != 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"extra_commit != NULL || extra_commit_len == 0");
    ctx_local._4_4_ = 0;
  }
  else if (gen == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"gen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_pedersen_commitment_load((secp256k1_ge *)&genp.infinity,commit);
      secp256k1_generator_load((secp256k1_ge *)local_118,gen);
      ctx_local._4_4_ =
           secp256k1_rangeproof_verify_impl
                     (&ctx->ecmult_gen_ctx,blind_out,value_out,message_out,outlen,nonce,min_value,
                      max_value,(secp256k1_ge *)&genp.infinity,proof,plen,extra_commit,
                      extra_commit_len,(secp256k1_ge *)local_118);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_rangeproof_rewind(const secp256k1_context* ctx,
 unsigned char *blind_out, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen) {
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(message_out != NULL || outlen == NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_verify_impl(&ctx->ecmult_gen_ctx,
     blind_out, value_out, message_out, outlen, nonce, min_value, max_value, &commitp, proof, plen, extra_commit, extra_commit_len, &genp);
}